

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int iVar1;
  size_t *in_RCX;
  void **in_RDX;
  archive_read *in_RSI;
  archive *in_RDI;
  int ret;
  rar *rar;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  CPpmd7 *p;
  int local_4;
  
  p = *(CPpmd7 **)in_RDI[0x15].archive_format_name;
  if (*(int *)(p[1].HB2Flag + 0x4c) == -1) {
    p[1].HB2Flag[0x4c] = '\0';
    p[1].HB2Flag[0x4d] = '\0';
    p[1].HB2Flag[0x4e] = '\0';
    p[1].HB2Flag[0x4f] = '\0';
  }
  if (0 < *(long *)(p->Units2Indx + 6)) {
    __archive_read_consume
              ((archive_read *)p,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    *(int64_t *)(p->Units2Indx + 6) = 0;
  }
  if ((p->Units2Indx[0x53] == '\0') &&
     ((long)((archive_read_client *)(p->Units2Indx + 0x2e))->opener < (long)*(char **)&p->HiBitsFlag
     )) {
    iVar1 = (int)*(char *)((long)&p->FoundState + 7);
    if (iVar1 == 0x30) {
      local_4 = read_data_stored(in_RSI,in_RDX,in_RCX,(int64_t *)p);
    }
    else if (iVar1 - 0x31U < 5) {
      local_4 = read_data_compressed(a,buff,size,offset);
      if ((local_4 != 0) && (local_4 != -0x14)) {
        Ppmd7_Free(p,(ISzAlloc *)CONCAT44(local_4,iVar1));
      }
    }
    else {
      archive_set_error(in_RDI,0x54,"Unsupported compression method for RAR file.");
      local_4 = -0x1e;
    }
  }
  else {
    (in_RSI->archive).magic = 0;
    (in_RSI->archive).state = 0;
    *in_RDX = (void *)0x0;
    *in_RCX = *(size_t *)(p->Units2Indx + 0x1e);
    if ((long)*in_RCX < (long)*(char **)&p->HiBitsFlag) {
      *in_RCX = (size_t)*(char **)&p->HiBitsFlag;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *buff = NULL;
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN)
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context, &g_szalloc);
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}